

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

StaticArray<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Corrade::Utility::String::anon_unknown_0::rpartitionInternal
          (StaticArray<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,anon_unknown_0 *this,string *string,
          ArrayView<const_char> separator)

{
  size_t sVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  size_t pos;
  string *string_local;
  ArrayView<const_char> separator_local;
  
  separator_local._data = separator._data;
  pos = (size_t)this;
  string_local = string;
  separator_local._size = (size_t)__return_storage_ptr__;
  pcVar2 = Containers::ArrayView::operator_cast_to_char_((ArrayView *)&string_local);
  Containers::ArrayView<const_char>::size((ArrayView<const_char> *)&string_local);
  local_30 = std::__cxx11::string::rfind((char *)this,(ulong)pcVar2,0xffffffffffffffff);
  if (local_30 == -1) {
    std::__cxx11::string::string((string *)&local_50);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,pos);
  }
  sVar1 = pos;
  if (local_30 == -1) {
    std::__cxx11::string::string((string *)&local_70);
  }
  else {
    Containers::ArrayView<const_char>::size((ArrayView<const_char> *)&string_local);
    std::__cxx11::string::substr((ulong)&local_70,sVar1);
  }
  sVar1 = pos;
  if (local_30 == -1) {
    std::__cxx11::string::substr((ulong)&local_a0,pos);
  }
  else {
    Containers::ArrayView<const_char>::size((ArrayView<const_char> *)&string_local);
    std::__cxx11::string::substr((ulong)&local_a0,sVar1);
  }
  Containers::
  StaticArray<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,&local_50,&local_70,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Containers::StaticArray<3, std::string> rpartitionInternal(const std::string& string, Containers::ArrayView<const char> separator) {
    const std::size_t pos = string.rfind(separator, std::string::npos, separator.size());
    return {
        pos == std::string::npos ? std::string{} : string.substr(0, pos),
        pos == std::string::npos ? std::string{} : string.substr(pos, separator.size()),
        pos == std::string::npos ? string.substr(0) : string.substr(pos + separator.size())
    };
}